

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

DrawStyle * __thiscall CMU462::DynamicScene::Skeleton::get_draw_style(Skeleton *this,Joint *joint)

{
  Scene *pSVar1;
  long lVar2;
  
  pSVar1 = (this->super_SceneObject).scene;
  if (pSVar1 != (Scene *)0x0) {
    if ((Joint *)(pSVar1->selected).object == joint) {
      lVar2 = 0x1a8;
      goto LAB_00182a95;
    }
    if ((Joint *)(pSVar1->hovered).object == joint) {
      lVar2 = 0x1a0;
      goto LAB_00182a95;
    }
  }
  lVar2 = 0x198;
LAB_00182a95:
  return *(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar2);
}

Assistant:

DrawStyle *Skeleton::get_draw_style(Joint* joint) const
  {
    if (scene && joint == scene->selected.object)
    {
      return selectedStyle;
    }

    if (scene && joint == scene->hovered.object)
    {
      return hoveredStyle;
    }

    return defaultStyle;
  }